

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O2

void __thiscall ParallelForLoop1D::RunStep(ParallelForLoop1D *this,unique_lock<std::mutex> *lock)

{
  long __args;
  _func_int **pp_Var1;
  int iVar2;
  long __args_1;
  
  __args = this->nextIndex;
  pp_Var1 = (this->super_ParallelJob)._vptr_ParallelJob;
  __args_1 = this->chunkSize + __args;
  if (this->maxIndex < __args_1) {
    __args_1 = this->maxIndex;
  }
  this->nextIndex = __args_1;
  iVar2 = (*pp_Var1[3])();
  if ((char)iVar2 == '\0') {
    ThreadPool::RemoveFromJobList
              ((ThreadPool *)
               threadPool._M_t.super___uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>.
               _M_t.super__Tuple_impl<0UL,_ThreadPool_*,_std::default_delete<ThreadPool>_>.
               super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl,&this->super_ParallelJob);
  }
  std::unique_lock<std::mutex>::unlock(lock);
  std::function<void_(long,_long)>::operator()(&this->func,__args,__args_1);
  return;
}

Assistant:

void ParallelForLoop1D::RunStep(std::unique_lock<std::mutex> *lock) {
    // Find the set of loop iterations to run next
    int64_t indexStart = nextIndex;
    int64_t indexEnd = std::min(indexStart + chunkSize, maxIndex);

    // Update _loop_ to reflect iterations this thread will run
    nextIndex = indexEnd;

    if (!HaveWork())
        threadPool->RemoveFromJobList(this);

    lock->unlock();

    // Run loop indices in _[indexStart, indexEnd)_
    func(indexStart, indexEnd);
}